

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

int64_t c_v256_dotp_s16(c_v256 a,c_v256 b)

{
  c_v128 b_00;
  c_v128 b_01;
  c_v128 a_00;
  c_v128 a_01;
  int64_t iVar1;
  int64_t iVar2;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  a_00.u64[1] = in_stack_00000038;
  a_00.u64[0] = in_stack_ffffffffffffffd8;
  b_00.u64[1] = in_stack_ffffffffffffffd0;
  b_00.u64[0] = in_stack_ffffffffffffffc8;
  iVar1 = c_v128_dotp_s16(a_00,b_00);
  a_01.u64[1] = in_stack_00000038;
  a_01.u64[0] = in_stack_00000010;
  b_01.u64[1] = in_stack_00000008;
  b_01.u64[0] = in_stack_00000030;
  iVar2 = c_v128_dotp_s16(a_01,b_01);
  return iVar1 + iVar2;
}

Assistant:

SIMD_INLINE int64_t c_v256_dotp_s16(c_v256 a, c_v256 b) {
  return c_v128_dotp_s16(a.v128[1], b.v128[1]) +
         c_v128_dotp_s16(a.v128[0], b.v128[0]);
}